

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  time_t tVar4;
  time_t now;
  char otp [13];
  int local_4c;
  time_t local_48;
  char local_3d [13];
  
  local_48 = 0;
  iVar2 = getopt(argc,argv,"hl:t:T:");
  if (iVar2 == -1) {
    local_4c = 0x1e;
    bVar1 = true;
    uVar3 = 8;
  }
  else {
    uVar3 = 8;
    bVar1 = false;
    local_4c = 0x1e;
    do {
      switch(iVar2 << 0x1e | iVar2 - 0x54U >> 2) {
      case 0:
        local_4c = atoi(_optarg);
        break;
      default:
        main_cold_1();
        goto LAB_0010137e;
      case 5:
        fprintf(_stdout,
                "Usage: %s [-h] [-l length] [-t time] [-T step] <secret>\n  -h          Print this help message and quit\n  -l length   Set the password length. Defaults to %d, max is %d\n  -t time     Set the time. Defaults to current time\n  -T step     Set time step. Defaults to %d\n"
                ,*argv,8,0xc,0x1e);
        return 0;
      case 6:
        uVar3 = atoi(_optarg);
        if (0xc < (int)uVar3) {
          fprintf(_stderr,"Password length %d exceeds maximum of %d",(ulong)uVar3,0xc);
          goto LAB_0010137e;
        }
        break;
      case 8:
        local_48 = atol(_optarg);
        bVar1 = true;
      }
      iVar2 = getopt(argc,argv,"hl:t:T:");
    } while (iVar2 != -1);
    bVar1 = !bVar1;
  }
  if (_optind + 1 == argc) {
    if ((bVar1) && (tVar4 = time(&local_48), tVar4 == -1)) {
      perror("time");
      iVar2 = -1;
    }
    else {
      mtotp_totp(argv[_optind],local_48,local_4c,uVar3,local_3d);
      puts(local_3d);
      iVar2 = 0;
    }
  }
  else {
    main_cold_2();
LAB_0010137e:
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
  time_t now = 0;
  char otp[OTP_MAX_LENGTH + 1];
  int otp_length = OTP_DEFAULT_LENGTH;
  int opt;
  int tfnd = 0;
  int time_step = TIME_STEP_DEFAULT;

  while ((opt = getopt(argc, argv, "hl:t:T:")) != -1) {
    switch (opt) {
    case 'h':
      print_usage(stdout, argv[0]);
      return 0;
    case 'l':
      otp_length = atoi(optarg);
      if (otp_length > OTP_MAX_LENGTH) {
        fprintf(stderr, "Password length %d exceeds maximum of %d", otp_length,
                OTP_MAX_LENGTH);
        return 1;
      }
      break;
    case 't':
      now = atol(optarg);
      tfnd = 1;
      break;
    case 'T':
      time_step = atoi(optarg);
      break;
    default:
      print_usage(stderr, argv[0]);
      return 1;
    }
  }

  if (optind + 1 != argc) {
    print_usage(stderr, argv[0]);
    return 1;
  }

  if (!tfnd && time(&now) == -1) {
    perror("time");
    return -1;
  }

  mtotp_totp(argv[optind], now, time_step, otp_length, otp);
  printf("%s\n", otp);
  return 0;
}